

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZlibReader.cpp
# Opt level: O0

void __thiscall ZlibReader::ZlibReader(ZlibReader *this,void *buf,size_t size)

{
  size_t size_local;
  void *buf_local;
  ZlibReader *this_local;
  
  this->_vptr_ZlibReader = (_func_int **)&PTR__ZlibReader_00113d58;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->zbuf);
  this->initialized = false;
  assign(this,buf,size);
  this->initialized = true;
  return;
}

Assistant:

ZlibReader::ZlibReader(const void * buf, size_t size) :
	initialized(false)
{
	assign(buf, size);
	initialized = true;
}